

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebugManager.cpp
# Opt level: O0

JsDiagDebugEvent __thiscall
JsrtDebugManager::GetDebugEventFromStopType(JsrtDebugManager *this,StopType stopType)

{
  StopType stopType_local;
  JsrtDebugManager *this_local;
  
  switch(stopType) {
  case STOP_BREAKPOINT:
    this_local._4_4_ = JsDiagDebugEventBreakpoint;
    break;
  case STOP_INLINEBREAKPOINT:
    this_local._4_4_ = JsDiagDebugEventDebuggerStatement;
    break;
  case STOP_STEPCOMPLETE:
    this_local._4_4_ = JsDiagDebugEventStepComplete;
    break;
  case STOP_EXCEPTIONTHROW:
    this_local._4_4_ = JsDiagDebugEventRuntimeException;
    break;
  case STOP_ASYNCBREAK:
    this_local._4_4_ = JsDiagDebugEventAsyncBreak;
    break;
  case STOP_MUTATIONBREAKPOINT:
  default:
    this_local._4_4_ = JsDiagDebugEventBreakpoint;
  }
  return this_local._4_4_;
}

Assistant:

JsDiagDebugEvent JsrtDebugManager::GetDebugEventFromStopType(Js::StopType stopType)
{
    switch (stopType)
    {
    case Js::STOP_BREAKPOINT: return JsDiagDebugEventBreakpoint;
    case Js::STOP_INLINEBREAKPOINT: return JsDiagDebugEventDebuggerStatement;
    case Js::STOP_STEPCOMPLETE: return JsDiagDebugEventStepComplete;
    case Js::STOP_EXCEPTIONTHROW: return JsDiagDebugEventRuntimeException;
    case Js::STOP_ASYNCBREAK: return JsDiagDebugEventAsyncBreak;

    case Js::STOP_MUTATIONBREAKPOINT:
    default:
        Assert("Unhandled stoptype");
        break;
    }

    return JsDiagDebugEventBreakpoint;
}